

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::stringifyBinaryExpr<signed_char,signed_char>(char *lhs,char *op,char *rhs)

{
  String *in_RDI;
  String *in_stack_ffffffffffffff70;
  String *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  
  doctest::toString(in_stack_ffffffffffffffaf);
  String::String(in_stack_ffffffffffffff70,(char *)in_RDI);
  String::operator+((String *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                    in_stack_ffffffffffffffa0);
  doctest::toString(in_stack_ffffffffffffffaf);
  String::operator+((String *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                    in_stack_ffffffffffffffa0);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  return in_RDI;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }